

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_image *
nk_subimage_id(nk_image *__return_storage_ptr__,int id,unsigned_short w,unsigned_short h,nk_rect r)

{
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  nk_zero(__return_storage_ptr__,0x18);
  (__return_storage_ptr__->handle).id = id;
  __return_storage_ptr__->w = w;
  __return_storage_ptr__->h = h;
  local_48 = r.x;
  fStack_44 = r.y;
  __return_storage_ptr__->region[0] = (unsigned_short)(int)local_48;
  __return_storage_ptr__->region[1] = (unsigned_short)(int)fStack_44;
  local_38 = r.w;
  fStack_34 = r.h;
  __return_storage_ptr__->region[2] = (unsigned_short)(int)local_38;
  __return_storage_ptr__->region[3] = (unsigned_short)(int)fStack_34;
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_image
nk_subimage_id(int id, unsigned short w, unsigned short h, struct nk_rect r)
{
    struct nk_image s;
    nk_zero(&s, sizeof(s));
    s.handle.id = id;
    s.w = w; s.h = h;
    s.region[0] = (unsigned short)r.x;
    s.region[1] = (unsigned short)r.y;
    s.region[2] = (unsigned short)r.w;
    s.region[3] = (unsigned short)r.h;
    return s;
}